

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O1

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  pointer pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined8 in_RAX;
  string *psVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  undefined8 uVar10;
  bool excludeFromAll;
  pointer inName;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string binPath;
  string srcPath;
  string local_e8;
  string local_c8;
  pointer local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 local_88;
  undefined4 local_7c;
  string local_78;
  string local_58;
  string *local_38;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (inName == pbVar1) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    bVar4 = 0;
  }
  else {
    this = status->Makefile;
    local_38 = (string *)&status->Error;
    local_7c = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    excludeFromAll = false;
    do {
      iVar5 = std::__cxx11::string::compare((char *)inName);
      if (iVar5 == 0) {
        excludeFromAll = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)inName);
        if (iVar5 != 0) {
          psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar2 = (psVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar2,pcVar2 + psVar6->_M_string_length);
          std::__cxx11::string::append((char *)&local_c8);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c8,(ulong)(inName->_M_dataplus)._M_p);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_58.field_2._M_allocated_capacity = *psVar9;
            local_58.field_2._8_8_ = plVar7[3];
          }
          else {
            local_58.field_2._M_allocated_capacity = *psVar9;
            local_58._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_58._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = cmsys::SystemTools::FileIsDirectory(&local_58);
          if (bVar3) {
            psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            pcVar2 = (psVar6->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,pcVar2,pcVar2 + psVar6->_M_string_length);
            std::__cxx11::string::append((char *)&local_e8);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_e8,(ulong)(inName->_M_dataplus)._M_p);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8.field_2._8_8_ = puVar8[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar9;
              local_c8._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_c8._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            cmMakefile::AddSubDirectory(this,&local_58,&local_c8,excludeFromAll,false,false);
LAB_00295597:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar3) {
              psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              pcVar2 = (psVar6->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,pcVar2,pcVar2 + psVar6->_M_string_length);
              std::__cxx11::string::append((char *)&local_e8);
              cmsys::SystemTools::GetFilenameName(&local_78,inName);
              uVar10 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                uVar10 = local_e8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar10 < local_78._M_string_length + local_e8._M_string_length) {
                uVar10 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  uVar10 = local_78.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar10 < local_78._M_string_length + local_e8._M_string_length)
                goto LAB_002953e2;
                puVar8 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_78,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p)
                ;
              }
              else {
LAB_002953e2:
                puVar8 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_e8,(ulong)local_78._M_dataplus._M_p);
              }
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              psVar9 = puVar8 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_c8.field_2._M_allocated_capacity = *psVar9;
                local_c8.field_2._8_8_ = puVar8[3];
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar9;
                local_c8._M_dataplus._M_p = (pointer)*puVar8;
              }
              local_c8._M_string_length = puVar8[1];
              *puVar8 = psVar9;
              puVar8[1] = 0;
              *(undefined1 *)psVar9 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              cmMakefile::AddSubDirectory(this,inName,&local_c8,excludeFromAll,false,false);
              goto LAB_00295597;
            }
            local_c8._M_dataplus._M_p = (pointer)0x26;
            local_c8._M_string_length = 0x7d2ad8;
            local_c8.field_2._M_allocated_capacity = 0;
            local_a8 = (inName->_M_dataplus)._M_p;
            local_c8.field_2._8_8_ = inName->_M_string_length;
            local_a0 = 0;
            local_98 = 0x10;
            local_90 = " does not exist.";
            local_88 = 0;
            views._M_len = 3;
            views._M_array = (iterator)&local_c8;
            cmCatViews(&local_e8,views);
            std::__cxx11::string::_M_assign(local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            local_7c = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != pbVar1);
    bVar4 = (byte)local_7c;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}